

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpackutil.c
# Opt level: O2

int fp_preflight(int argc,char **argv,int unpack,fpstate *fpptr)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  char *__s;
  uint uVar8;
  char *pcVar9;
  long lVar10;
  undefined8 local_450;
  char outfits [513];
  char local_23b [3];
  char infits [513];
  
  if (fpptr->initialized == 0x2a) {
    lVar10 = (long)fpptr->firstfile;
    pcVar9 = fpptr->outfile;
    __s = fpptr->prefix;
    local_450 = (long)argc;
    bVar1 = false;
    while( true ) {
      if (local_450 <= lVar10) {
        fpptr->preflight_checked = fpptr->preflight_checked + 1;
        return 0;
      }
      outfits[0] = '\0';
      pcVar6 = argv[lVar10];
      sVar5 = strlen(pcVar6);
      if (0x1fd < sVar5) break;
      strncpy(infits,pcVar6,0x201);
      cVar2 = infits[0];
      if ((infits[0] == '-') && (infits[1] != '\0')) {
        fp_msg("Error: invalid input file name\n   ");
        pcVar9 = argv[lVar10];
LAB_00107731:
        fp_msg(pcVar9);
        pcVar9 = "\n";
        goto LAB_0010773d;
      }
      pcVar6 = strchr(infits,0x5b);
      if ((pcVar6 != (char *)0x0) || (pcVar6 = strchr(infits,0x5d), pcVar6 != (char *)0x0)) {
        pcVar9 = "Error: section/extension notation not supported: ";
LAB_001076a5:
        fp_msg(pcVar9);
        pcVar9 = infits;
        goto LAB_00107731;
      }
      if (unpack != 0) {
        if (cVar2 != '-') {
          iVar3 = fp_access(infits);
          if (iVar3 == 0) {
            sVar5 = strlen(infits);
            sVar7 = strlen(infits);
            builtin_strncpy(infits + sVar7,".fz",4);
            iVar3 = fp_access(infits);
            infits[(int)sVar5] = '\0';
            if (iVar3 == 0) {
              fp_msg("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
              fp_msg(infits);
              fp_msg("\n  ");
              fp_msg(infits);
              pcVar9 = ".fz\n";
              goto LAB_0010773d;
            }
          }
          else {
            sVar5 = strlen(infits);
            builtin_strncpy(infits + sVar5,".fz",4);
            iVar3 = fp_access(infits);
            if (iVar3 != 0) goto LAB_001076f5;
          }
        }
        if (fpptr->to_stdout != 0) goto LAB_0010750e;
        if (*pcVar9 != '\0') {
LAB_00107323:
          if (bVar1) {
            fp_msg("Error: cannot use same output file name for multiple files:\n   ");
            goto LAB_00107731;
          }
          iVar3 = fp_access(pcVar9);
          bVar1 = true;
          if (iVar3 != 0) goto LAB_0010750e;
          fp_msg("Error: output file already exists:\n ");
          goto LAB_001077cc;
        }
        if (*__s != '\0') {
          sVar5 = strlen(__s);
          sVar7 = strlen(infits);
          if (0x200 < sVar7 + sVar5) {
            fp_msg("Error: output file name for\n   ");
            fp_msg(infits);
            pcVar9 = "\n   is too long with the prefix\n";
            goto LAB_0010773d;
          }
          strcpy(outfits,__s);
        }
        cVar2 = infits[0];
        if (infits[0] == '-') {
          builtin_strncpy(outfits,"output.fits",0xc);
        }
        else {
          strcat(outfits,infits);
        }
        sVar5 = strlen(outfits);
        uVar8 = (uint)sVar5;
        if (2 < (int)uVar8) {
          iVar3 = strcmp(".gz",outfits + ((ulong)(uVar8 & 0x7fffffff) - 3));
          if (iVar3 == 0) {
            iVar3 = -3;
LAB_00107423:
            outfits[uVar8 + iVar3] = '\0';
          }
          else if (uVar8 != 3) {
            iVar4 = strcmp(".bz2",outfits + ((ulong)(uVar8 & 0x7fffffff) - 4));
            iVar3 = -4;
            if (iVar4 == 0) goto LAB_00107423;
          }
        }
        if (cVar2 != '-') {
          sVar5 = strlen(outfits);
          uVar8 = (uint)sVar5;
          if (((int)uVar8 < 3) ||
             (iVar3 = strcmp(".fz",outfits + ((ulong)(uVar8 & 0x7fffffff) - 3)), iVar3 != 0)) {
            if (fpptr->delete_suffix != 0) {
              fp_msg("Error: input compressed file ");
              fp_msg(infits);
              pcVar9 = "\n does not have the default .fz suffix.\n";
              goto LAB_0010773d;
            }
          }
          else {
            outfits[uVar8 - 3] = '\0';
          }
        }
        iVar3 = strcmp(infits,outfits);
        if ((iVar3 == 0) || (iVar3 = fp_access(outfits), iVar3 != 0)) {
          if (fpptr->do_gzip_file == 0) goto LAB_0010750e;
          sVar5 = strlen(outfits);
          if (0xfffffffffffffdfe < sVar5 - 0x1fe) {
            sVar5 = strlen(outfits);
            builtin_strncpy(outfits + sVar5,".gz",4);
            iVar3 = fp_access(outfits);
            if (iVar3 == 0) goto LAB_00107677;
            sVar5 = strlen(outfits);
            outfits[(long)((sVar5 << 0x20) + -0x300000000) >> 0x20] = '\0';
            goto LAB_0010750e;
          }
LAB_001077bb:
          pcVar9 = "Error: output file name too long:\n ";
        }
        else {
LAB_00107677:
          pcVar9 = "Error: output file already exists:\n ";
        }
        fp_msg(pcVar9);
        pcVar9 = outfits;
LAB_001077cc:
        fp_msg(pcVar9);
        pcVar9 = "\n ";
        goto LAB_0010773d;
      }
      if ((cVar2 != '-') && (iVar3 = fp_access(infits), iVar3 != 0)) {
        sVar5 = strlen(infits);
        if (0xfffffffffffffdfe < sVar5 - 0x1fe) {
          sVar5 = strlen(infits);
          builtin_strncpy(infits + sVar5,".gz",4);
          iVar3 = fp_access(infits);
          if (iVar3 != 0) {
LAB_001076f5:
            pcVar9 = infits;
            sVar5 = strlen(pcVar9);
            infits[(long)((sVar5 << 0x20) + -0x300000000) >> 0x20] = '\0';
            fp_msg("Error: can\'t find or read input file ");
            goto LAB_00107731;
          }
          goto LAB_0010725a;
        }
        fp_msg("Error: input file name too long:\n ");
        pcVar9 = infits;
        goto LAB_001077cc;
      }
LAB_0010725a:
      sVar5 = strlen(infits);
      if ((2 < (int)(uint)sVar5) &&
         (iVar3 = strcmp(".fz",local_23b + ((uint)sVar5 & 0x7fffffff)), iVar3 == 0)) {
        pcVar9 = "Error: fpack input file already has \'.fz\' suffix\n";
        goto LAB_001076a5;
      }
      if ((fpptr->to_stdout == 0) && (fpptr->test_all == 0)) {
        if (*pcVar9 != '\0') goto LAB_00107323;
        if (infits[0] == '-') {
          builtin_strncpy(outfits,"input.fits",0xb);
        }
        else {
          strcpy(outfits,infits);
        }
        sVar5 = strlen(outfits);
        uVar8 = (uint)sVar5;
        if (2 < (int)uVar8) {
          iVar3 = strcmp(".gz",outfits + ((ulong)(uVar8 & 0x7fffffff) - 3));
          iVar4 = -3;
          if (iVar3 == 0) {
LAB_00107583:
            outfits[uVar8 + iVar4] = '\0';
          }
          else if (uVar8 != 3) {
            iVar3 = strcmp(".bz2",outfits + ((ulong)(uVar8 & 0x7fffffff) - 4));
            iVar4 = -4;
            if (iVar3 == 0) goto LAB_00107583;
          }
        }
        sVar5 = strlen(outfits);
        uVar8 = (uint)sVar5;
        if ((3 < (int)uVar8) &&
           (iVar3 = strcmp(".imh",outfits + ((ulong)(uVar8 & 0x7fffffff) - 4)), iVar3 == 0)) {
          outfits[uVar8 - 4] = '\0';
          sVar5 = strlen(outfits);
          sVar7 = strlen(outfits);
          if (sVar5 == 0x1fc) {
            outfits[sVar7 + 4] = '\0';
          }
          else {
            (outfits + sVar7 + 4)[0] = 's';
            (outfits + sVar7 + 4)[1] = '\0';
          }
          builtin_strncpy(outfits + sVar7,".fit",4);
        }
        if (fpptr->clobber == 0) {
          sVar5 = strlen(outfits);
          if (0x1fd < sVar5) goto LAB_001077bb;
          sVar5 = strlen(outfits);
          builtin_strncpy(outfits + sVar5,".fz",4);
        }
        iVar3 = strcmp(infits,outfits);
        if ((iVar3 != 0) && (iVar3 = fp_access(outfits), iVar3 == 0)) goto LAB_00107677;
      }
LAB_0010750e:
      lVar10 = lVar10 + 1;
    }
    fp_msg("Error: input file name\n   ");
    fp_msg(argv[lVar10]);
    pcVar9 = "\n   is too long\n";
LAB_0010773d:
    fp_msg(pcVar9);
    fp_noop();
  }
  else {
    fp_msg("Error: internal initialization error\n");
  }
  exit(-1);
}

Assistant:

int fp_preflight (int argc, char *argv[], int unpack, fpstate *fpptr)
{
	char	infits[SZ_STR], outfits[SZ_STR];
	int	iarg, namelen, nfiles = 0;

	if (fpptr->initialized != FP_INIT_MAGIC) {
	    fp_msg ("Error: internal initialization error\n"); exit (-1);
	}

	for (iarg=fpptr->firstfile; iarg < argc; iarg++) {

            outfits[0] = '\0';
	    
            if (strlen(argv[iarg]) > SZ_STR - 4) {  /* allow for .fz or .gz suffix */
		    fp_msg ("Error: input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n   is too long\n"); fp_noop (); exit (-1);
	    }

	    strncpy (infits, argv[iarg], SZ_STR);
	    if (infits[0] == '-' && infits[1] != '\0') {  
	         /* don't interpret this as intending to read input file from stdin */
		    fp_msg ("Error: invalid input file name\n   "); fp_msg (argv[iarg]);
		    fp_msg ("\n"); fp_noop (); exit (-1);
	    }

	    if (strchr (infits, '[') || strchr (infits, ']')) {
		fp_msg ("Error: section/extension notation not supported: ");
		fp_msg (infits); fp_msg ("\n"); fp_noop (); exit (-1);
	    }
	    
            if (unpack) {
	  	/* ********** This section applies to funpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	         if (fp_access (infits) != 0) {  /* if not, then check if */
		    strcat(infits, ".fz");       /* a .fz version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	         } else {   /* make sure a .fz version of the same file doesn't exist */
                    namelen = strlen(infits);
		    strcat(infits, ".fz");   
	            if (fp_access (infits) == 0) {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		        fp_msg ("Error: ambiguous input file name.  Which file should be unpacked?:\n  ");
		        fp_msg (infits); fp_msg ("\n  "); 
		        fp_msg (infits); fp_msg (".fz\n"); 
		        fp_noop (); exit (-1);
                    } else {
                        infits[namelen] = '\0';  /* remove the .fz suffix */
		    }
	         }
	      }

              /* if writing to stdout, then we are all done */
	      if (fpptr->to_stdout) {
                      continue;
	      }

              if (fpptr->outfile[0]) {  /* user specified output file name */
	          nfiles++;
		  if (nfiles > 1) {
		      fp_msg ("Error: cannot use same output file name for multiple files:\n   ");
		      fp_msg (fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
	          }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
	      }     

	      /* construct output file name to test */
	      if (fpptr->prefix[0]) {
                  if (strlen(fpptr->prefix) + strlen(infits) > SZ_STR - 1) {
		      fp_msg ("Error: output file name for\n   "); fp_msg (infits);
		      fp_msg ("\n   is too long with the prefix\n"); fp_noop (); exit (-1);
	          }
	          strcpy(outfits,fpptr->prefix);
	      }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "output.fits");
	      } else {
	        strcat(outfits, infits);
	      }

	      /* remove .gz or .bz2 suffix, if present (output is not gzipped) */
              namelen = strlen(outfits);
	      if (namelen >= 3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }

	      /* check for .fz suffix that is sometimes required */
	      /* and remove it if present */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
                 namelen = strlen(outfits);
	         if (namelen>=3 && !strcmp(".fz", outfits + namelen - 3) ) { /* suffix is present */
                        outfits[namelen - 3] = '\0';
	         } else if (fpptr->delete_suffix) {  /* required suffix is missing */
		    fp_msg ("Error: input compressed file "); fp_msg (infits);
		    fp_msg ("\n does not have the default .fz suffix.\n"); 
		    fp_noop (); exit (-1);
	         }
	      }

	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }

	      /* if gzipping the output, make sure .gz file doesn't exist */
	      if (fpptr->do_gzip_file) {
                        if (strlen(outfits)+3 > SZ_STR-1)
                        {
		            fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
                        }
	                strcat(outfits, ".gz");
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
              		namelen = strlen(outfits);
                        outfits[namelen - 3] = '\0';  /* remove the .gz suffix again */
	      }
	  } else {
	  	/* ********** This section applies to fpack ************ */

	      /* check that input file  exists */
	      if (infits[0] != '-') {  /* if not reading from stdin stream */
	        if (fp_access (infits) != 0) {  /* if not, then check if */
                    if (strlen(infits)+3 > SZ_STR-1)
                    {
		        fp_msg ("Error: input file name too long:\n "); fp_msg (infits);
		        fp_msg ("\n "); fp_noop (); exit (-1);
                    }
		    strcat(infits, ".gz");     /* a gzipped version exsits */
	            if (fp_access (infits) != 0) {
                        namelen = strlen(infits);
                        infits[namelen - 3] = '\0';  /* remove the .gz suffix */
		        fp_msg ("Error: can't find or read input file "); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
                    }
	        }
	      }

              /* make sure the file to pack does not already have a .fz suffix */
              namelen = strlen(infits);
	      if (namelen>=3 && !strcmp(".fz", infits + namelen - 3) ) {
		        fp_msg ("Error: fpack input file already has '.fz' suffix\n" ); fp_msg (infits);
		        fp_msg ("\n"); fp_noop (); exit (-1);
	      }

              /* if writing to stdout, or just testing the files, then we are all done */
	      if (fpptr->to_stdout || fpptr->test_all) {
                        continue;
	      }
              
              if (fpptr->outfile[0]) { /* user specified output file name */
                  nfiles++;
                  if (nfiles > 1) {
                      fp_msg("Error: cannot use same output file name for multiple files:\n   ");
                      fp_msg(fpptr->outfile);
		      fp_msg ("\n"); fp_noop (); exit (-1);
                  }

                  /* check that output file doesn't exist */
	          if (fp_access (fpptr->outfile) == 0) {
		            fp_msg ("Error: output file already exists:\n "); 
			    fp_msg (fpptr->outfile);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		  } 
                  continue;
              }

	      /* construct output file name */
	      if (infits[0] == '-') {
	        strcpy(outfits, "input.fits");
	      } else {
	        strcpy(outfits, infits);
	      }

	      /* remove .gz suffix, if present (output is not gzipped) */
              /* do the same if compression suffix is bz2 */
              namelen = strlen(outfits);
	      if (namelen >=3 && !strcmp(".gz", outfits + namelen - 3) ) {
                        outfits[namelen - 3] = '\0';
	      }
              else if (namelen >= 4 && !strcmp(".bz2", outfits + namelen - 4)) {
                        outfits[namelen - 4] = '\0';
              }
              
	      
	      /* remove .imh suffix (IRAF format image), and replace with .fits */
              namelen = strlen(outfits);
	      if (namelen >=4 && !strcmp(".imh", outfits + namelen - 4) ) {
                        outfits[namelen - 4] = '\0';
                        if (strlen(outfits) == SZ_STR-5)
                           strcat(outfits, ".fit");
                        else
                           strcat(outfits, ".fits");
	      }

	      /* If not clobbering the input file, add .fz suffix to output name */
	      if (! fpptr->clobber)
              {
                 if (strlen(outfits) > SZ_STR-4)
                 {
		    fp_msg ("Error: output file name too long:\n "); fp_msg (outfits);
		    fp_msg ("\n "); fp_noop (); exit (-1);
                 }
                 else
		     strcat(outfits, ".fz");
              }
			
	      /* if infits != outfits, make sure outfits doesn't already exist */
              if (strcmp(infits, outfits)) {
	                if (fp_access (outfits) == 0) {
		            fp_msg ("Error: output file already exists:\n "); fp_msg (outfits);
		            fp_msg ("\n "); fp_noop (); exit (-1);
		        }       
	      }
	  }   /* end of fpack section */
	}

	fpptr->preflight_checked++;
	return(0);
}